

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collect.h
# Opt level: O2

void __thiscall
async_simple::coro::detail::
CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1149:37)>_>
::~CollectAnyVariadicPairAwaiter
          (CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
           *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_result).
              super___shared_ptr<std::optional<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1149:37)>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
                  *)this);
  return;
}

Assistant:

CollectAnyVariadicPairAwaiter(Ts&&... inputs)
        : _input(std::move(inputs)...), _result(nullptr) {}